

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZCompMesh_*,_3>::Resize
          (TPZManVector<TPZCompMesh_*,_3> *this,int64_t newsize,TPZCompMesh **object)

{
  TPZCompMesh **ppTVar1;
  TPZCompMesh *pTVar2;
  ostream *poVar3;
  TPZCompMesh **ppTVar4;
  long lVar5;
  ulong uVar6;
  int64_t i;
  long lVar7;
  double dVar8;
  
  if (-1 < newsize) {
    lVar7 = (this->super_TPZVec<TPZCompMesh_*>).fNElements;
    if (lVar7 != newsize) {
      lVar5 = (this->super_TPZVec<TPZCompMesh_*>).fNAlloc;
      if (lVar5 < newsize) {
        if ((ulong)newsize < 4) {
          ppTVar4 = (this->super_TPZVec<TPZCompMesh_*>).fStore;
          ppTVar1 = this->fExtAlloc;
          lVar5 = 0;
          if (lVar7 < 1) {
            lVar7 = lVar5;
          }
          for (; lVar7 != lVar5; lVar5 = lVar5 + 1) {
            ppTVar1[lVar5] = ppTVar4[lVar5];
          }
          for (; lVar7 < newsize; lVar7 = lVar7 + 1) {
            ppTVar1[lVar7] = *object;
          }
          ppTVar4 = (this->super_TPZVec<TPZCompMesh_*>).fStore;
          if (ppTVar4 != (TPZCompMesh **)0x0 && ppTVar4 != ppTVar1) {
            operator_delete__(ppTVar4);
          }
          (this->super_TPZVec<TPZCompMesh_*>).fStore = ppTVar1;
          (this->super_TPZVec<TPZCompMesh_*>).fNElements = newsize;
          (this->super_TPZVec<TPZCompMesh_*>).fNAlloc = 3;
        }
        else {
          dVar8 = (double)lVar5 * 1.2;
          uVar6 = (long)dVar8;
          if (dVar8 < (double)newsize) {
            uVar6 = newsize;
          }
          lVar5 = 0;
          ppTVar4 = (TPZCompMesh **)operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8);
          ppTVar1 = (this->super_TPZVec<TPZCompMesh_*>).fStore;
          if (lVar7 < 1) {
            lVar7 = lVar5;
          }
          for (; lVar7 != lVar5; lVar5 = lVar5 + 1) {
            ppTVar4[lVar5] = ppTVar1[lVar5];
          }
          pTVar2 = *object;
          for (; lVar7 < newsize; lVar7 = lVar7 + 1) {
            ppTVar4[lVar7] = pTVar2;
          }
          if (ppTVar1 != (TPZCompMesh **)0x0 && ppTVar1 != this->fExtAlloc) {
            operator_delete__(ppTVar1);
          }
          (this->super_TPZVec<TPZCompMesh_*>).fStore = ppTVar4;
          (this->super_TPZVec<TPZCompMesh_*>).fNElements = newsize;
          (this->super_TPZVec<TPZCompMesh_*>).fNAlloc = uVar6;
        }
      }
      else {
        for (; lVar7 < newsize; lVar7 = lVar7 + 1) {
          (this->super_TPZVec<TPZCompMesh_*>).fStore[lVar7] = *object;
        }
        (this->super_TPZVec<TPZCompMesh_*>).fNElements = newsize;
      }
    }
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}